

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ninja.cc
# Opt level: O2

int __thiscall
anon_unknown.dwarf_38a::NinjaMain::ToolQuery(NinjaMain *this,Options *options,int argc,char **argv)

{
  Node *node;
  bool bVar1;
  uint uVar2;
  ulong uVar3;
  Node *pNVar4;
  Edge *pEVar5;
  ulong uVar6;
  char *pcVar7;
  pointer ppNVar8;
  int in;
  ulong uVar9;
  pointer ppEVar10;
  string err;
  DyndepLoader dyndep_loader;
  
  if (argc == 0) {
    Error("expected a target to query");
    uVar2 = 1;
  }
  else {
    dyndep_loader.state_ = &this->state_;
    dyndep_loader.disk_interface_ = &(this->disk_interface_).super_DiskInterface;
    uVar6 = (ulong)(uint)argc;
    if (argc < 1) {
      uVar6 = 0;
    }
    uVar9 = 0;
    do {
      uVar3 = uVar9;
      if (uVar3 == uVar6) break;
      err._M_dataplus._M_p = (pointer)&err.field_2;
      err._M_string_length = 0;
      err.field_2._M_local_buf[0] = '\0';
      pNVar4 = CollectTarget(this,argv[uVar3],&err);
      if (pNVar4 == (Node *)0x0) {
        Error("%s",err._M_dataplus._M_p);
      }
      else {
        printf("%s:\n",(pNVar4->path_)._M_dataplus._M_p);
        pEVar5 = pNVar4->in_edge_;
        if (pEVar5 != (Edge *)0x0) {
          node = pEVar5->dyndep_;
          if ((node != (Node *)0x0) && (node->dyndep_pending_ == true)) {
            bVar1 = DyndepLoader::LoadDyndeps(&dyndep_loader,node,&err);
            if (!bVar1) {
              Warning("%s\n",err._M_dataplus._M_p);
            }
          }
          printf("  input: %s\n",(pEVar5->rule_->name_)._M_dataplus._M_p);
          for (uVar9 = 0;
              (long)uVar9 <
              (long)(int)((ulong)((long)(pEVar5->inputs_).
                                        super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                                        super__Vector_impl_data._M_finish -
                                 (long)(pEVar5->inputs_).
                                       super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                                       super__Vector_impl_data._M_start) >> 3); uVar9 = uVar9 + 1) {
            bVar1 = Edge::is_implicit(pEVar5,uVar9);
            ppNVar8 = (pEVar5->inputs_).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                      super__Vector_impl_data._M_start;
            pcVar7 = "| ";
            if ((!bVar1) &&
               (pcVar7 = "|| ",
               uVar9 < (ulong)(((long)(pEVar5->inputs_).
                                      super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                                      super__Vector_impl_data._M_finish - (long)ppNVar8 >> 3) -
                              (long)pEVar5->order_only_deps_))) {
              pcVar7 = "";
            }
            printf("    %s%s\n",pcVar7,(ppNVar8[uVar9]->path_)._M_dataplus._M_p);
          }
        }
        puts("  outputs:");
        for (ppEVar10 = (pNVar4->out_edges_).super__Vector_base<Edge_*,_std::allocator<Edge_*>_>.
                        _M_impl.super__Vector_impl_data._M_start;
            ppEVar10 !=
            (pNVar4->out_edges_).super__Vector_base<Edge_*,_std::allocator<Edge_*>_>._M_impl.
            super__Vector_impl_data._M_finish; ppEVar10 = ppEVar10 + 1) {
          pEVar5 = *ppEVar10;
          for (ppNVar8 = (pEVar5->outputs_).super__Vector_base<Node_*,_std::allocator<Node_*>_>.
                         _M_impl.super__Vector_impl_data._M_start;
              ppNVar8 !=
              (pEVar5->outputs_).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
              super__Vector_impl_data._M_finish; ppNVar8 = ppNVar8 + 1) {
            printf("    %s\n",((*ppNVar8)->path_)._M_dataplus._M_p);
            pEVar5 = *ppEVar10;
          }
        }
      }
      std::__cxx11::string::~string((string *)&err);
      uVar9 = uVar3 + 1;
    } while (pNVar4 != (Node *)0x0);
    uVar2 = (uint)((long)uVar3 < (long)argc);
  }
  return uVar2;
}

Assistant:

int NinjaMain::ToolQuery(const Options* options, int argc, char* argv[]) {
  if (argc == 0) {
    Error("expected a target to query");
    return 1;
  }

  DyndepLoader dyndep_loader(&state_, &disk_interface_);

  for (int i = 0; i < argc; ++i) {
    string err;
    Node* node = CollectTarget(argv[i], &err);
    if (!node) {
      Error("%s", err.c_str());
      return 1;
    }

    printf("%s:\n", node->path().c_str());
    if (Edge* edge = node->in_edge()) {
      if (edge->dyndep_ && edge->dyndep_->dyndep_pending()) {
        if (!dyndep_loader.LoadDyndeps(edge->dyndep_, &err)) {
          Warning("%s\n", err.c_str());
        }
      }
      printf("  input: %s\n", edge->rule_->name().c_str());
      for (int in = 0; in < (int)edge->inputs_.size(); in++) {
        const char* label = "";
        if (edge->is_implicit(in))
          label = "| ";
        else if (edge->is_order_only(in))
          label = "|| ";
        printf("    %s%s\n", label, edge->inputs_[in]->path().c_str());
      }
    }
    printf("  outputs:\n");
    for (vector<Edge*>::const_iterator edge = node->out_edges().begin();
         edge != node->out_edges().end(); ++edge) {
      for (vector<Node*>::iterator out = (*edge)->outputs_.begin();
           out != (*edge)->outputs_.end(); ++out) {
        printf("    %s\n", (*out)->path().c_str());
      }
    }
  }
  return 0;
}